

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

PrimitiveInstantiationSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::PrimitiveInstantiationSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::parsing::Token&,slang::syntax::NetStrengthSyntax*&,slang::syntax::TimingControlSyntax*&,slang::syntax::SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax>const&,slang::parsing::Token&>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          Token *args_1,NetStrengthSyntax **args_2,TimingControlSyntax **args_3,
          SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax> *args_4,Token *args_5)

{
  Token type;
  Token semi;
  PrimitiveInstantiationSyntax *this_00;
  
  this_00 = (PrimitiveInstantiationSyntax *)allocate(this,0xb8,8);
  type.kind = args_1->kind;
  type._2_1_ = args_1->field_0x2;
  type.numFlags.raw = (args_1->numFlags).raw;
  type.rawLen = args_1->rawLen;
  type.info = args_1->info;
  semi.kind = args_5->kind;
  semi._2_1_ = args_5->field_0x2;
  semi.numFlags.raw = (args_5->numFlags).raw;
  semi.rawLen = args_5->rawLen;
  semi.info = args_5->info;
  slang::syntax::PrimitiveInstantiationSyntax::PrimitiveInstantiationSyntax
            (this_00,args,type,*args_2,*args_3,args_4,semi);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }